

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  Parameters *extraout_RDX_00;
  Parameters *extraout_RDX_01;
  Parameters *extraout_RDX_02;
  string local_518;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_4f8;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_4d8;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_478;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_458;
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  
  Environment::Environment(&env,(Context *)this,1);
  Framebuffer::Resources::Resources(&res0,&env,extraout_RDX);
  Framebuffer::Resources::Resources(&res1,&env,extraout_RDX_00);
  Framebuffer::Resources::Resources(&res2,&env,extraout_RDX_01);
  Framebuffer::Resources::Resources(&res3,&env,extraout_RDX_02);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_4f8,&env,&res0,param_4);
  local_518.field_2._M_allocated_capacity = (size_type)local_4f8.m_data.deleter.m_device;
  local_518.field_2._8_8_ = local_4f8.m_data.deleter.m_allocator;
  local_518._M_dataplus._M_p = (pointer)local_4f8.m_data.object.m_internal;
  local_518._M_string_length = (size_type)local_4f8.m_data.deleter.m_deviceIface;
  local_4f8.m_data.object.m_internal = 0;
  local_4f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_4f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_4f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_4f8);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_4d8,&env,&res1,param_4);
  local_4f8.m_data.deleter.m_device = local_4d8.m_data.deleter.m_device;
  local_4f8.m_data.deleter.m_allocator = local_4d8.m_data.deleter.m_allocator;
  local_4f8.m_data.object.m_internal = local_4d8.m_data.object.m_internal;
  local_4f8.m_data.deleter.m_deviceIface = local_4d8.m_data.deleter.m_deviceIface;
  local_4d8.m_data.object.m_internal = 0;
  local_4d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_4d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_4d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_4d8);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_478,&env,&res2,param_4);
  local_4d8.m_data.deleter.m_device = local_478.m_data.deleter.m_device;
  local_4d8.m_data.deleter.m_allocator = local_478.m_data.deleter.m_allocator;
  local_4d8.m_data.object.m_internal = local_478.m_data.object.m_internal;
  local_4d8.m_data.deleter.m_deviceIface = local_478.m_data.deleter.m_deviceIface;
  local_478.m_data.object.m_internal = 0;
  local_478.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_478.m_data.deleter.m_device = (VkDevice)0x0;
  local_478.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_478);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_458,&env,&res3,param_4);
  local_478.m_data.deleter.m_device = local_458.m_data.deleter.m_device;
  local_478.m_data.deleter.m_allocator = local_458.m_data.deleter.m_allocator;
  local_478.m_data.object.m_internal = local_458.m_data.object.m_internal;
  local_478.m_data.deleter.m_deviceIface = local_458.m_data.deleter.m_deviceIface;
  local_458.m_data.object.m_internal = 0;
  local_458.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_458.m_data.deleter.m_device = (VkDevice)0x0;
  local_458.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_458);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_478);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_4d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_4f8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_518);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"Ok",(allocator<char> *)&local_4f8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  Framebuffer::Resources::~Resources(&res3);
  Framebuffer::Resources::~Resources(&res2);
  Framebuffer::Resources::~Resources(&res1);
  Framebuffer::Resources::~Resources(&res0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}